

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimProfile(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint local_24;
  int nUnique;
  int nC1s;
  int nC0s;
  int nWords;
  Vec_Wrd_t *vSims;
  Gia_Man_t *pGia_local;
  
  vSims = (Vec_Wrd_t *)pGia;
  _nC0s = Gia_ManSimPatSim(pGia);
  iVar1 = Vec_WrdSize(_nC0s);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vSims);
  nC1s = iVar1 / iVar2;
  nUnique = 0;
  local_24 = 0;
  uVar3 = Gia_ManSimPatHashPatterns((Gia_Man_t *)vSims,nC1s,_nC0s,&nUnique,(int *)&local_24);
  uVar4 = nC1s << 6;
  iVar1 = Gia_ManCandNum((Gia_Man_t *)vSims);
  uVar5 = Gia_ManCandNum((Gia_Man_t *)vSims);
  printf("Simulating %d patterns leads to %d unique objects (%.2f %% out of %d), Const0 = %d. Const1 = %d.\n"
         ,((double)(int)uVar3 * 100.0) / (double)iVar1,(ulong)uVar4,(ulong)uVar3,(ulong)uVar5,
         (ulong)(uint)nUnique,(ulong)local_24);
  Vec_WrdFree(_nC0s);
  return;
}

Assistant:

void Gia_ManSimProfile( Gia_Man_t * pGia )
{
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( pGia );
    int nWords = Vec_WrdSize(vSims) / Gia_ManObjNum(pGia);
    int nC0s = 0, nC1s = 0, nUnique = Gia_ManSimPatHashPatterns( pGia, nWords, vSims, &nC0s, &nC1s );
    printf( "Simulating %d patterns leads to %d unique objects (%.2f %% out of %d), Const0 = %d. Const1 = %d.\n", 
        64*nWords, nUnique, 100.0*nUnique/Gia_ManCandNum(pGia), Gia_ManCandNum(pGia), nC0s, nC1s );
    Vec_WrdFree( vSims );
}